

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

char16 * __thiscall
Js::JavascriptString::GetNormalizedString
          (JavascriptString *this,NormalizationForm form,ArenaAllocator *tempAllocator,
          charcount_t *sizeOfNormalizedStringWithoutNullTerminator)

{
  code *pcVar1;
  charcount_t *this_00;
  NormalizationForm NVar2;
  bool bVar3;
  charcount_t cVar4;
  int iVar5;
  int32 iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  undefined4 extraout_var_01;
  undefined4 *puVar7;
  TrackAllocData local_70;
  char16 *local_48;
  char16 *tmpBuffer;
  int32 sizeEstimate;
  ApiError error;
  ScriptContext *scriptContext;
  charcount_t *sizeOfNormalizedStringWithoutNullTerminator_local;
  ArenaAllocator *tempAllocator_local;
  JavascriptString *pJStack_18;
  NormalizationForm form_local;
  JavascriptString *this_local;
  
  scriptContext = (ScriptContext *)sizeOfNormalizedStringWithoutNullTerminator;
  sizeOfNormalizedStringWithoutNullTerminator_local = (charcount_t *)tempAllocator;
  tempAllocator_local._4_4_ = form;
  pJStack_18 = this;
  _sizeEstimate = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
  cVar4 = GetLength(this);
  NVar2 = tempAllocator_local._4_4_;
  if (cVar4 == 0) {
    *(undefined4 *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = 0;
  }
  else {
    iVar5 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])();
    cVar4 = GetLength(this);
    bVar3 = PlatformAgnostic::UnicodeText::IsNormalizedString
                      (NVar2,(char16 *)CONCAT44(extraout_var,iVar5),cVar4);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xeb9,
                                  "(!UnicodeText::IsNormalizedString(form, this->GetSz(), this->GetLength()))"
                                  ,
                                  "!UnicodeText::IsNormalizedString(form, this->GetSz(), this->GetLength())"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    NVar2 = tempAllocator_local._4_4_;
    iVar5 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])();
    cVar4 = GetLength(this);
    tmpBuffer._0_4_ =
         PlatformAgnostic::UnicodeText::NormalizeString
                   (NVar2,(char16 *)CONCAT44(extraout_var_00,iVar5),cVar4 + 1,(char16 *)0x0,0,
                    (ApiError *)((long)&tmpBuffer + 4));
    local_48 = (char16 *)0x0;
    while (this_00 = sizeOfNormalizedStringWithoutNullTerminator_local, tmpBuffer._4_4_ == 3) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_70,(type_info *)&char16_t::typeinfo,0,(long)(int)(uint)tmpBuffer,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                 ,0xec2);
      this_01 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )this_00,&local_70);
      local_48 = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                           ((Memory *)this_01,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                            (long)(int)(uint)tmpBuffer);
      NVar2 = tempAllocator_local._4_4_;
      iVar5 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x65])();
      cVar4 = GetLength(this);
      iVar6 = PlatformAgnostic::UnicodeText::NormalizeString
                        (NVar2,(char16 *)CONCAT44(extraout_var_01,iVar5),cVar4 + 1,local_48,
                         (uint)tmpBuffer,(ApiError *)((long)&tmpBuffer + 4));
      if (0 < iVar6) {
        *(int32 *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = iVar6 + -1;
        return local_48;
      }
      tmpBuffer._0_4_ = -iVar6;
    }
    if (tmpBuffer._4_4_ != 0) {
      if (tmpBuffer._4_4_ == 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0xed5,"(false)",
                                    "Invalid Parameter- check pointers passed to NormalizeString");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
        JavascriptError::ThrowRangeError(_sizeEstimate,-0x7ff5ea1d,(PCWSTR)0x0);
      }
      if (tmpBuffer._4_4_ != 2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0xee4,"(false)","Unknown error");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
        JavascriptError::ThrowRangeError(_sizeEstimate,-0x7ff5ea1d,(PCWSTR)0x0);
      }
      JavascriptError::ThrowRangeErrorVar(_sizeEstimate,-0x7ff5ea1e,(ulong)(uint)tmpBuffer);
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xedf,"(false)",
                                "This code path should not be hit, empty string case is handled above. Perhaps a false error (sizeEstimate <= 0; but lastError == 0; ERROR_SUCCESS and NO_ERRROR == 0)"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
    *(undefined4 *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = 0;
  }
  return (char16 *)0x0;
}

Assistant:

char16* JavascriptString::GetNormalizedString(PlatformAgnostic::UnicodeText::NormalizationForm form, ArenaAllocator* tempAllocator, charcount_t& sizeOfNormalizedStringWithoutNullTerminator)
    {
        using namespace PlatformAgnostic;

        ScriptContext* scriptContext = this->GetScriptContext();
        if (this->GetLength() == 0)
        {
            sizeOfNormalizedStringWithoutNullTerminator = 0;
            return nullptr;
        }

        // IMPORTANT: Implementation Notes
        // Normalize string estimates the required size of the buffer based on averages and other data.
        // It is very hard to get a precise size from an input string without expanding/contracting it on the buffer.
        // It is estimated that the maximum size the string after an NFC is 6x the input length, and 18x for NFD. This approach isn't very feasible as well.
        // The approach taken is based on the simple example in the MSDN article.
        //  - Loop until the return value is either an error (apart from insufficient buffer size), or success.
        //  - Each time recreate a temporary buffer based on the last guess.
        //  - When creating the JS string, use the positive return value and copy the buffer across.
        // Design choice for "guesses" comes from data Windows collected; and in most cases the loop will not iterate more than 2 times.

        Assert(!UnicodeText::IsNormalizedString(form, this->GetSz(), this->GetLength()));

        //Get the first size estimate
        UnicodeText::ApiError error;
        int32 sizeEstimate = UnicodeText::NormalizeString(form, this->GetSz(), this->GetLength() + 1, nullptr, 0, &error);
        char16 *tmpBuffer = nullptr;
        //Loop while the size estimate is bigger than 0
        while (error == UnicodeText::ApiError::InsufficientBuffer)
        {
            tmpBuffer = AnewArray(tempAllocator, char16, sizeEstimate);
            sizeEstimate = UnicodeText::NormalizeString(form, this->GetSz(), this->GetLength() + 1, tmpBuffer, sizeEstimate, &error);

            // Success, sizeEstimate is the exact size including the null terminator
            if (sizeEstimate > 0)
            {
                sizeOfNormalizedStringWithoutNullTerminator = sizeEstimate - 1;
                return tmpBuffer;
            }

            // Anything less than 0, we have an error, flip sizeEstimate now. As both times we need to use it, we need positive anyways.
            sizeEstimate *= -1;

        }

        switch (error)
        {
            case UnicodeText::ApiError::InvalidParameter:
                //some invalid parameter, coding error
                AssertMsg(false, "Invalid Parameter- check pointers passed to NormalizeString");
                JavascriptError::ThrowRangeError(scriptContext, JSERR_FailedToNormalize);
                break;
            case UnicodeText::ApiError::InvalidUnicodeText:
                //the value returned is the negative index of an invalid unicode character
                JavascriptError::ThrowRangeErrorVar(scriptContext, JSERR_InvalidUnicodeCharacter, sizeEstimate);
                break;
            case UnicodeText::ApiError::NoError:
                //The actual size of the output string is zero.
                //Theoretically only empty input string should produce this, which is handled above, thus the code path should not be hit.
                AssertMsg(false, "This code path should not be hit, empty string case is handled above. Perhaps a false error (sizeEstimate <= 0; but lastError == 0; ERROR_SUCCESS and NO_ERRROR == 0)");
                sizeOfNormalizedStringWithoutNullTerminator = 0;
                return nullptr; // scriptContext->GetLibrary()->GetEmptyString();
                break;
            default:
                AssertMsg(false, "Unknown error");
                JavascriptError::ThrowRangeError(scriptContext, JSERR_FailedToNormalize);
                break;
        }
    }